

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arxmlStorage.cpp
# Opt level: O2

string * __thiscall
lsp::ShortnameElement::getFullPath_abi_cxx11_(string *__return_storage_ptr__,ShortnameElement *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  if ((this->path)._M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  else {
    std::operator+(&bStack_38,&this->path,"/");
    std::operator+(__return_storage_ptr__,&bStack_38,&this->name);
    std::__cxx11::string::~string((string *)&bStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string lsp::ShortnameElement::getFullPath() const
{
    if(path.length())
    {
        return path + "/" + name;
    }
    else
    {
        return name;
    }
}